

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoadConstantNDLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  RepeatedField<unsigned_long> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  string *layerName;
  bool bVar4;
  LayerUnion LVar5;
  long *plVar6;
  unsigned_long *puVar7;
  WeightParams *pWVar8;
  size_type *psVar9;
  uint uVar10;
  _Alloc_hider _Var11;
  int index;
  uint64_t expectedUnits;
  string err;
  Result r;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  undefined1 local_b8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  LayerUnion local_58;
  string local_50;
  
  Result::Result((Result *)&local_80);
  validateInputCount((Result *)local_c8,layer,0,0);
  local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_c8;
  std::__cxx11::string::operator=((string *)&local_78,(string *)&local_c0);
  bVar4 = Result::good((Result *)&local_80);
  pcVar2 = local_b8 + 8;
  if (local_c0._M_p != pcVar2) {
    operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
  }
  if (bVar4) {
    validateOutputCount((Result *)local_c8,layer,1,1);
    local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c8;
    std::__cxx11::string::operator=((string *)&local_78,(string *)&local_c0);
    bVar4 = Result::good((Result *)&local_80);
    if (local_c0._M_p != pcVar2) {
      operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
    }
    if (bVar4) {
      if (layer->_oneof_case_[0] == 0x42e) {
        LVar5 = layer->layer_;
      }
      else {
        LVar5.loadconstantnd_ = Specification::LoadConstantNDLayerParams::default_instance();
      }
      uVar3 = ((LVar5.convolution_)->kernelsize_).current_size_;
      if (uVar3 == 0) {
        std::operator+(&local_a0,"Target shape is required parameter for \'",(layer->name_).ptr_);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
        psVar9 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_b8._0_8_ = *psVar9;
          local_b8._8_8_ = plVar6[3];
          local_c8 = (undefined1  [8])local_b8;
        }
        else {
          local_b8._0_8_ = *psVar9;
          local_c8 = (undefined1  [8])*plVar6;
        }
        local_c0._M_p = (pointer)plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c8);
        local_a0.field_2._M_allocated_capacity = local_b8._0_8_;
        _Var11._M_p = (pointer)local_c8;
        if (local_c8 == (undefined1  [8])local_b8) goto LAB_0055792d;
      }
      else {
        pWVar8 = (LVar5.batchnorm_)->variance_;
        if (pWVar8 == (WeightParams *)0x0) {
          pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        bVar4 = 0 < (pWVar8->floatvalue_).current_size_;
        uVar10 = bVar4 + 1;
        if (((pWVar8->float16value_).ptr_)->_M_string_length == 0) {
          uVar10 = (uint)bVar4;
        }
        if (((uVar10 - (((pWVar8->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
            (uint)(((pWVar8->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
          if (uVar3 < 6) {
            this_00 = &(LVar5.convolution_)->kernelsize_;
            local_58 = LVar5;
            if (this_00->current_size_ < 1) {
              expectedUnits = 1;
            }
            else {
              expectedUnits = 1;
              index = 0;
              do {
                puVar7 = google::protobuf::RepeatedField<unsigned_long>::Get(this_00,index);
                expectedUnits = expectedUnits * *puVar7;
                index = index + 1;
              } while (index < this_00->current_size_);
            }
            pWVar8 = (local_58.batchnorm_)->variance_;
            if (pWVar8 == (WeightParams *)0x0) {
              pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"LoadConstantND","")
            ;
            layerName = (layer->name_).ptr_;
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"constants","");
            validateGeneralWeightParams
                      ((Result *)local_c8,pWVar8,expectedUnits,1,&local_a0,layerName,&local_50);
            local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_c8;
            std::__cxx11::string::operator=((string *)&local_78,(string *)&local_c0);
            if (local_c0._M_p != pcVar2) {
              operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            bVar4 = Result::good((Result *)&local_80);
            if (bVar4) {
              Result::Result(__return_storage_ptr__);
              goto LAB_0055792d;
            }
            goto LAB_005578df;
          }
          std::operator+(&local_a0,"LoadConstantND layer \'",(layer->name_).ptr_);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
          local_c8 = (undefined1  [8])local_b8;
          psVar9 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_b8._0_8_ = *psVar9;
            local_b8._8_8_ = plVar6[3];
          }
          else {
            local_b8._0_8_ = *psVar9;
            local_c8 = (undefined1  [8])*plVar6;
          }
          local_c0._M_p = (pointer)plVar6[1];
          *plVar6 = (long)psVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c8);
        }
        else {
          std::operator+(&local_a0,"LoadConstantND layer \'",(layer->name_).ptr_);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
          local_c8 = (undefined1  [8])local_b8;
          psVar9 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_b8._0_8_ = *psVar9;
            local_b8._8_8_ = plVar6[3];
          }
          else {
            local_b8._0_8_ = *psVar9;
            local_c8 = (undefined1  [8])*plVar6;
          }
          local_c0._M_p = (pointer)plVar6[1];
          *plVar6 = (long)psVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c8);
        }
        if (local_c8 != (undefined1  [8])local_b8) {
          operator_delete((void *)local_c8,local_b8._0_8_ + 1);
        }
        _Var11._M_p = local_a0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_0055792d;
      }
      operator_delete(_Var11._M_p,local_a0.field_2._M_allocated_capacity + 1);
      goto LAB_0055792d;
    }
  }
LAB_005578df:
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_80;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p == &local_68) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_68._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_78._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_70;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_78._M_p = (pointer)&local_68;
LAB_0055792d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,
                    CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoadConstantNDLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 0, 0)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;

    const auto& params = layer.loadconstantnd();
    WeightParamType paramType = valueType(params.data());

    if (params.shape_size() == 0) {
        const std::string err = "Target shape is required parameter for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        return Result(ResultType::INVALID_MODEL_PARAMETERS,
                      "LoadConstantND layer '" + layer.name() + "' has both full precision and half precision weight fields populated");
    }
    if (!(params.shape_size() >= 1 && params.shape_size() <= 5)) {
        return Result(ResultType::INVALID_MODEL_PARAMETERS,
                      "LoadConstantND layer '" + layer.name() + "'can only accept shape of length 1 to 5");
    }
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }

    r = validateGeneralWeightParams(params.data(), total_shape, 1, "LoadConstantND", layer.name(), "constants");
    if (!r.good()) return r;

    return Result();
}